

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdConvert<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)16>,false>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Value VVar2;
  Simd<short,_(unsigned_char)__b_> result;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  undefined8 local_10;
  
  VVar2 = Pop(this);
  local_10 = VVar2.field_0._8_8_;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    *(short *)((long)&local_28 + lVar1 * 2) = (short)*(char *)((long)&local_10 + lVar1);
  }
  Push(this,(Value)local_28.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdConvert() {
  using SL = typename S::LaneType;
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = Convert<SL>(val[(low ? 0 : S::lanes) + i]);
  }
  Push(result);
  return RunResult::Ok;
}